

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::ExternalParser::DoPath(ExternalParser *this,string *path)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s1;
  char *__s2;
  size_t __n;
  string local_58 [32];
  undefined1 local_38 [8];
  string local_path;
  string *path_local;
  ExternalParser *this_local;
  
  local_path.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)local_38);
  uVar3 = std::__cxx11::string::size();
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < uVar3) {
    __s1 = (char *)std::__cxx11::string::c_str();
    __s2 = (char *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    iVar2 = strncmp(__s1,__s2,__n);
    uVar1 = local_path.field_2._8_8_;
    if (iVar2 == 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_58,uVar1);
      std::__cxx11::string::operator=((string *)local_38,local_58);
      std::__cxx11::string::~string(local_58);
      goto LAB_002668ce;
    }
  }
  std::__cxx11::string::operator=((string *)local_38,(string *)local_path.field_2._8_8_);
LAB_002668ce:
  std::__cxx11::list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>>::
  emplace_back<std::__cxx11::string&>
            ((list<cmCTestSVN::SVNInfo,std::allocator<cmCTestSVN::SVNInfo>> *)
             &this->SVN->Repositories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DoPath(std::string const& path)
  {
    // Get local path relative to the source directory
    std::string local_path;
    if (path.size() > this->SVN->SourceDirectory.size() &&
        strncmp(path.c_str(), this->SVN->SourceDirectory.c_str(),
                this->SVN->SourceDirectory.size()) == 0) {
      local_path = path.substr(this->SVN->SourceDirectory.size() + 1);
    } else {
      local_path = path;
    }
    this->SVN->Repositories.emplace_back(local_path);
  }